

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityGenerator.h
# Opt level: O2

PduPtr * EntityGenerator::GenerateEntityRef(void)

{
  Header6 *this;
  ostream *this_00;
  Entity_State_PDU *this_01;
  KUINT16 EntityID;
  KRef_Ptr<KDIS::PDU::Header7> *in_RDI;
  KString KStack_2b8;
  KRef_Ptr<KDIS::PDU::Header7> *local_298;
  EntityType EntType;
  EntityIdentifier EntID;
  EntityCapabilities EntEC;
  EntityAppearance EntEA;
  EntityMarking EntMarking;
  Vector EntityLinearVelocity;
  WorldCoordinates EntityLocation;
  DeadReckoningParameter DRP;
  KStringStream name;
  ostream local_1a8 [376];
  
  id = id + 1;
  EntityID = (KUINT16)id;
  local_298 = in_RDI;
  KDIS::DATA_TYPE::EntityIdentifier::EntityIdentifier(&EntID,1,0xbb9,EntityID);
  KDIS::DATA_TYPE::EntityType::EntityType(&EntType,'\x03','\x01',0xe1,'\x03','\0','\x01','\0');
  KDIS::DATA_TYPE::Vector::Vector(&EntityLinearVelocity,0.0,0.0,0.0);
  KDIS::DATA_TYPE::WorldCoordinates::WorldCoordinates
            (&EntityLocation,3974445.65712107,220612.57183252,4966838.38051275);
  KDIS::DATA_TYPE::EntityAppearance::EntityAppearance(&EntEA);
  KDIS::DATA_TYPE::Vector::Vector((Vector *)&name,0.0,0.0,0.0);
  KDIS::DATA_TYPE::Vector::Vector((Vector *)&KStack_2b8,0.0,0.0,0.0);
  KDIS::DATA_TYPE::DeadReckoningParameter::DeadReckoningParameter
            (&DRP,Static,(Vector *)&name,(Vector *)&KStack_2b8);
  KDIS::DATA_TYPE::DataTypeBase::~DataTypeBase((DataTypeBase *)&KStack_2b8);
  KDIS::DATA_TYPE::DataTypeBase::~DataTypeBase((DataTypeBase *)&name);
  std::__cxx11::stringstream::stringstream((stringstream *)&name);
  this_00 = std::operator<<(local_1a8,"Ent-");
  std::ostream::operator<<(this_00,EntityID);
  std::__cxx11::stringbuf::str();
  KDIS::DATA_TYPE::EntityMarking::EntityMarking(&EntMarking,ASCII,&KStack_2b8);
  std::__cxx11::string::~string((string *)&KStack_2b8);
  KDIS::DATA_TYPE::EntityCapabilities::EntityCapabilities(&EntEC,false,false,false,false);
  this_01 = (Entity_State_PDU *)operator_new(0x150);
  KDIS::DATA_TYPE::EulerAngles::EulerAngles((EulerAngles *)&KStack_2b8);
  KDIS::PDU::Entity_State_PDU::Entity_State_PDU
            (this_01,&EntID,Friendly,&EntType,&EntType,&EntityLinearVelocity,&EntityLocation,
             (EulerAngles *)&KStack_2b8,&EntEA,&DRP,&EntMarking,&EntEC);
  KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>::KRef_Ptr(local_298,(Header7 *)this_01);
  KDIS::DATA_TYPE::EulerAngles::~EulerAngles((EulerAngles *)&KStack_2b8);
  KDIS::PDU::Header6::SetExerciseID(&local_298->m_pRef->super_Header6,'\x01');
  this = &local_298->m_pRef->super_Header6;
  KDIS::DATA_TYPE::TimeStamp::TimeStamp((TimeStamp *)&KStack_2b8,RelativeTime,0,true);
  KDIS::PDU::Header6::SetTimeStamp(this,(TimeStamp *)&KStack_2b8);
  KDIS::DATA_TYPE::TimeStamp::~TimeStamp((TimeStamp *)&KStack_2b8);
  KDIS::DATA_TYPE::EntityCapabilities::~EntityCapabilities(&EntEC);
  KDIS::DATA_TYPE::EntityMarking::~EntityMarking(&EntMarking);
  std::__cxx11::stringstream::~stringstream((stringstream *)&name);
  KDIS::DATA_TYPE::DeadReckoningParameter::~DeadReckoningParameter(&DRP);
  KDIS::DATA_TYPE::EntityAppearance::~EntityAppearance(&EntEA);
  KDIS::DATA_TYPE::DataTypeBase::~DataTypeBase(&EntityLocation.super_DataTypeBase);
  KDIS::DATA_TYPE::DataTypeBase::~DataTypeBase(&EntityLinearVelocity.super_DataTypeBase);
  KDIS::DATA_TYPE::DataTypeBase::~DataTypeBase(&EntType.super_DataTypeBase);
  KDIS::DATA_TYPE::EntityIdentifier::~EntityIdentifier(&EntID);
  return local_298;
}

Assistant:

static PduPtr GenerateEntityRef()
	{
		// Generate a new value to use for our entity. Id, name, pos etc.
		KUINT16 randomValue = ++id;

		// First create the PDU we are going to send, for this example I will use a
		// Entity_State_PDU, When this PDU is sent most DIS applications should then show a new entity
		EntityIdentifier EntID( 1, 3001, randomValue );
		ForceID EntForceID( Friendly );
		EntityType EntType( 3, 1, 225, 3, 0, 1, 0 ); // A Civilian male
		Vector EntityLinearVelocity( 0, 0, 0 );

		// Location 
		KFLOAT64 GeoX = 3974445.65712107, GeoY = 220612.57183252, GeoZ = 4966838.38051275; // Cardiff 
		KFLOAT64 Heading = 0.0, Pitch = 0.0, Roll = 0.0;
		WorldCoordinates EntityLocation( GeoX, GeoY, GeoZ );

		// Appearance
		EntityAppearance EntEA; 
		DeadReckoningParameter DRP( Static, Vector( 0, 0, 0 ), Vector( 0, 0, 0 ) );
		KStringStream name;
		name << "Ent-" << randomValue;
		EntityMarking EntMarking( ASCII, name.str() );
		EntityCapabilities EntEC( false, false, false, false );

		// Create the PDU
		PduPtr pEntity( new Entity_State_PDU( EntID, EntForceID, EntType, EntType, EntityLinearVelocity,
                        EntityLocation, EulerAngles(), EntEA, DRP, EntMarking, EntEC ) );

		// Set the PDU Header values
		pEntity->SetExerciseID( 1 );

		// Set the time stamp to automatically calculate each time encode is called.
		pEntity->SetTimeStamp( TimeStamp( RelativeTime, 0, true ) );

		return pEntity;
	}